

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_fixed.hpp
# Opt level: O0

void __thiscall
protozero::fixed_size_buffer_adaptor::append_zeros(fixed_size_buffer_adaptor *this,size_t count)

{
  length_error *this_00;
  char local_25 [13];
  size_t local_18;
  size_t count_local;
  fixed_size_buffer_adaptor *this_local;
  
  local_18 = count;
  count_local = (size_t)this;
  if (this->m_capacity < this->m_size + count) {
    this_00 = (length_error *)__cxa_allocate_exception(0x10);
    std::length_error::length_error(this_00,"fixed size data store exhausted");
    __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
  }
  local_25[0] = '\0';
  std::fill_n<char*,unsigned_long,char>(this->m_data + this->m_size,count,local_25);
  this->m_size = local_18 + this->m_size;
  return;
}

Assistant:

void append_zeros(std::size_t count) {
        if (m_size + count > m_capacity) {
            throw std::length_error{"fixed size data store exhausted"};
        }
        std::fill_n(m_data + m_size, count, '\0');
        m_size += count;
    }